

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::PathTypeHandlerBase::IsFixedProperty
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId)

{
  code *pcVar1;
  bool bVar2;
  PropertyIndex index;
  uint uVar3;
  undefined4 *puVar4;
  
  uVar3 = 0;
  if (DAT_015d6361 == '\x01') {
    index = TypePath::LookupInline
                      ((this->typePath).ptr,propertyId,
                       (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    if (index == 0xffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xbda,"(index != Constants::NoSlot)","index != Constants::NoSlot"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    bVar2 = TypePath::GetIsFixedFieldAt
                      ((this->typePath).ptr,index,
                       (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1));
    uVar3 = (uint)bVar2;
  }
  return uVar3;
}

Assistant:

BOOL PathTypeHandlerBase::IsFixedProperty(const DynamicObject* instance, PropertyId propertyId)
    {
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        Assert(index != Constants::NoSlot);

        return this->GetTypePath()->GetIsFixedFieldAt(index, GetPathLength());
    }